

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printLineOrder(LineOrder lo)

{
  if (lo == RANDOM_Y) {
    std::operator<<((ostream *)&std::cout,"random y");
    return;
  }
  if (lo != DECREASING_Y) {
    if (lo == INCREASING_Y) {
      std::operator<<((ostream *)&std::cout,"increasing y");
      return;
    }
    std::ostream::operator<<(&std::cout,lo);
    return;
  }
  std::operator<<((ostream *)&std::cout,"decreasing y");
  return;
}

Assistant:

void
printLineOrder (LineOrder lo)
{
    switch (lo)
    {
        case INCREASING_Y: cout << "increasing y"; break;

        case DECREASING_Y: cout << "decreasing y"; break;

        case RANDOM_Y: cout << "random y"; break;

        default: cout << int (lo); break;
    }
}